

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswMan.c
# Opt level: O0

Csw_Man_t * Csw_ManStart(Aig_Man_t *pMan,int nCutsMax,int nLeafMax,int fVerbose)

{
  int iVar1;
  int iVar2;
  Csw_Man_t *p_00;
  Aig_Man_t *pAVar3;
  int *piVar4;
  Aig_Obj_t **ppAVar5;
  Csw_Cut_t **ppCVar6;
  Aig_MmFixed_t *pAVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  uint *puVar10;
  int local_34;
  int i;
  Aig_Obj_t *pObj;
  Csw_Man_t *p;
  int fVerbose_local;
  int nLeafMax_local;
  int nCutsMax_local;
  Aig_Man_t *pMan_local;
  
  if (nCutsMax < 2) {
    __assert_fail("nCutsMax >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswMan.c"
                  ,0x32,"Csw_Man_t *Csw_ManStart(Aig_Man_t *, int, int, int)");
  }
  if (0x10 < nLeafMax) {
    __assert_fail("nLeafMax <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswMan.c"
                  ,0x33,"Csw_Man_t *Csw_ManStart(Aig_Man_t *, int, int, int)");
  }
  p_00 = (Csw_Man_t *)malloc(0xa8);
  memset(p_00,0,0xa8);
  p_00->nCutsMax = nCutsMax;
  p_00->nLeafMax = nLeafMax;
  p_00->fVerbose = fVerbose;
  p_00->pManAig = pMan;
  pAVar3 = Aig_ManStartFrom(pMan);
  p_00->pManRes = pAVar3;
  iVar1 = Aig_ManCiNum(p_00->pManAig);
  iVar2 = Aig_ManCiNum(p_00->pManRes);
  if (iVar1 != iVar2) {
    __assert_fail("Aig_ManCiNum(p->pManAig) == Aig_ManCiNum(p->pManRes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswMan.c"
                  ,0x3d,"Csw_Man_t *Csw_ManStart(Aig_Man_t *, int, int, int)");
  }
  iVar1 = Aig_ManObjNumMax(pMan);
  piVar4 = (int *)malloc((long)iVar1 << 2);
  p_00->pnRefs = piVar4;
  iVar1 = Aig_ManObjNumMax(pMan);
  ppAVar5 = (Aig_Obj_t **)malloc((long)iVar1 << 3);
  p_00->pEquiv = ppAVar5;
  iVar1 = Aig_ManObjNumMax(pMan);
  ppCVar6 = (Csw_Cut_t **)malloc((long)iVar1 << 3);
  p_00->pCuts = ppCVar6;
  ppCVar6 = p_00->pCuts;
  iVar1 = Aig_ManObjNumMax(pMan);
  memset(ppCVar6,0,(long)iVar1 << 3);
  piVar4 = p_00->pnRefs;
  iVar1 = Aig_ManObjNumMax(pMan);
  memset(piVar4,0,(long)iVar1 << 2);
  iVar1 = Abc_TruthWordNum(nLeafMax);
  p_00->nTruthWords = iVar1;
  p_00->nCutSize = nLeafMax * 4 + 0x18 + p_00->nTruthWords * 4;
  pAVar7 = Aig_MmFixedStart(p_00->nCutSize * p_00->nCutsMax,0x200);
  p_00->pMemCuts = pAVar7;
  iVar1 = Aig_ManNodeNum(pMan);
  iVar1 = Abc_PrimeCudd((iVar1 * p_00->nCutsMax) / 2);
  p_00->nTableSize = iVar1;
  ppCVar6 = (Csw_Cut_t **)malloc((long)p_00->nTableSize << 3);
  p_00->pTable = ppCVar6;
  memset(p_00->pTable,0,(long)p_00->nTableSize << 3);
  pAVar8 = Aig_ManConst1(p_00->pManAig);
  pAVar9 = Aig_ManConst1(p_00->pManRes);
  Csw_ObjSetEquiv(p_00,pAVar8,pAVar9);
  for (local_34 = 0; iVar1 = Vec_PtrSize(p_00->pManAig->vCis), local_34 < iVar1;
      local_34 = local_34 + 1) {
    pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(p_00->pManAig->vCis,local_34);
    pAVar9 = Aig_ManCi(p_00->pManRes,local_34);
    Csw_ObjSetEquiv(p_00,pAVar8,pAVar9);
  }
  puVar10 = (uint *)malloc((long)(p_00->nTruthWords << 2) << 2);
  p_00->puTemp[0] = puVar10;
  p_00->puTemp[1] = p_00->puTemp[0] + p_00->nTruthWords;
  p_00->puTemp[2] = p_00->puTemp[1] + p_00->nTruthWords;
  p_00->puTemp[3] = p_00->puTemp[2] + p_00->nTruthWords;
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the cut sweeping manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Csw_Man_t * Csw_ManStart( Aig_Man_t * pMan, int nCutsMax, int nLeafMax, int fVerbose )
{
    Csw_Man_t * p;
    Aig_Obj_t * pObj;
    int i;
    assert( nCutsMax >= 2  );
    assert( nLeafMax <= 16 );
    // allocate the fraiging manager
    p = ABC_ALLOC( Csw_Man_t, 1 );
    memset( p, 0, sizeof(Csw_Man_t) );
    p->nCutsMax = nCutsMax;
    p->nLeafMax = nLeafMax;
    p->fVerbose = fVerbose;
    p->pManAig  = pMan;
    // create the new manager
    p->pManRes  = Aig_ManStartFrom( pMan );
    assert( Aig_ManCiNum(p->pManAig) == Aig_ManCiNum(p->pManRes) );
    // allocate room for cuts and equivalent nodes
    p->pnRefs   = ABC_ALLOC( int, Aig_ManObjNumMax(pMan) );
    p->pEquiv   = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(pMan) );
    p->pCuts    = ABC_ALLOC( Csw_Cut_t *, Aig_ManObjNumMax(pMan) );
    memset( p->pCuts, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(pMan) );
    memset( p->pnRefs, 0, sizeof(int) * Aig_ManObjNumMax(pMan) );
    // allocate memory manager
    p->nTruthWords = Abc_TruthWordNum(nLeafMax);
    p->nCutSize = sizeof(Csw_Cut_t) + sizeof(int) * nLeafMax + sizeof(unsigned) * p->nTruthWords;
    p->pMemCuts = Aig_MmFixedStart( p->nCutSize * p->nCutsMax, 512 );
    // allocate hash table for cuts
    p->nTableSize = Abc_PrimeCudd( Aig_ManNodeNum(pMan) * p->nCutsMax / 2 );
    p->pTable = ABC_ALLOC( Csw_Cut_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Aig_Obj_t *) * p->nTableSize );
    // set the pointers to the available fraig nodes
    Csw_ObjSetEquiv( p, Aig_ManConst1(p->pManAig), Aig_ManConst1(p->pManRes) );
    Aig_ManForEachCi( p->pManAig, pObj, i )
        Csw_ObjSetEquiv( p, pObj, Aig_ManCi(p->pManRes, i) );
    // room for temporary truth tables
    p->puTemp[0] = ABC_ALLOC( unsigned, 4 * p->nTruthWords );
    p->puTemp[1] = p->puTemp[0] + p->nTruthWords;
    p->puTemp[2] = p->puTemp[1] + p->nTruthWords;
    p->puTemp[3] = p->puTemp[2] + p->nTruthWords;
    return p;
}